

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.cxx
# Opt level: O3

bool __thiscall
cmCMakeMinimumRequired::InitialPass
          (cmCMakeMinimumRequired *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmCMakeMinimumRequired *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  char *__s;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pbVar13;
  uint required_minor;
  uint required_major;
  string version_string;
  uint required_tweak;
  uint required_patch;
  ostringstream e;
  char *local_200;
  long local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  uint local_1e0;
  uint local_1dc;
  cmCMakeMinimumRequired *local_1d8;
  string local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = &local_1f0;
  local_1f8 = 0;
  local_1f0 = '\0';
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar13) {
LAB_00348b06:
    if (local_1f8 == 0) {
      bVar3 = EnforceUnknownArguments(this);
      goto LAB_00348e06;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_MINIMUM_REQUIRED_VERSION","");
    cmMakefile::AddDefinition(pcVar1,(string *)local_1a8,local_200);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    uVar5 = cmVersion::GetMajorVersion();
    uVar6 = cmVersion::GetMinorVersion();
    uVar7 = cmVersion::GetPatchVersion();
    uVar8 = cmVersion::GetTweakVersion();
    local_1dc = 0;
    local_1e0 = 0;
    iVar4 = __isoc99_sscanf(local_200,"%u.%u.%u.%u");
    if (iVar4 < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"could not parse VERSION \"",0x19);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_200,local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".",2);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      if (((uVar6 == 0 && uVar5 == 0) && uVar7 < local_1dc) ||
         (((uVar6 == 0 && uVar5 == 0) && uVar7 == local_1dc && (uVar8 < local_1e0)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CMake ",6);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_200,local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9," or higher is required.  You are running version ",0x31);
        __s = cmVersion::GetCMakeVersion();
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
        }
        else {
          sVar10 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar10);
        }
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1d0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar3 = true;
        goto LAB_00348e06;
      }
      bVar3 = EnforceUnknownArguments(this);
      if (bVar3) {
        pcVar1 = (this->super_cmCommand).Makefile;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.","");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)local_1a8,false);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        bVar3 = true;
        cmMakefile::SetPolicyVersion((this->super_cmCommand).Makefile,"2.4");
        goto LAB_00348e06;
      }
    }
  }
  else {
    local_1b0 = &this->UnknownArguments;
    bVar3 = false;
    uVar11 = 0;
    uVar12 = 1;
    local_1d8 = this;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar13 + uVar11));
      if (iVar4 == 0) {
        bVar3 = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar11));
        if (iVar4 == 0) {
          if (bVar3) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"called with no value for VERSION.","");
            cmCommand::SetError(&local_1d8->super_cmCommand,(string *)local_1a8);
            goto LAB_00348d62;
          }
        }
        else {
          if (!bVar3) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_1b0,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar11);
            goto LAB_00348aac;
          }
          std::__cxx11::string::_M_assign((string *)&local_200);
        }
        bVar3 = false;
      }
LAB_00348aac:
      this_00 = local_1d8;
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar12 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >>
                              5);
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar2);
    this = local_1d8;
    if (!bVar3) goto LAB_00348b06;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with no value for VERSION.","");
    cmCommand::SetError(&this_00->super_cmCommand,(string *)local_1a8);
LAB_00348d62:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  bVar3 = false;
LAB_00348e06:
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  return bVar3;
}

Assistant:

bool cmCMakeMinimumRequired
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // Process arguments.
  std::string version_string;
  bool doing_version = false;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    if(args[i] == "VERSION")
      {
      doing_version = true;
      }
    else if(args[i] == "FATAL_ERROR")
      {
      if(doing_version)
        {
        this->SetError("called with no value for VERSION.");
        return false;
        }
      doing_version = false;
      }
    else if(doing_version)
      {
      doing_version = false;
      version_string = args[i];
      }
    else
      {
      this->UnknownArguments.push_back(args[i]);
      }
    }
  if(doing_version)
    {
    this->SetError("called with no value for VERSION.");
    return false;
    }

  // Make sure there was a version to check.
  if(version_string.empty())
    {
    return this->EnforceUnknownArguments();
    }

  // Save the required version string.
  this->Makefile->AddDefinition("CMAKE_MINIMUM_REQUIRED_VERSION",
                                version_string.c_str());


  // Get the current version number.
  unsigned int current_major = cmVersion::GetMajorVersion();
  unsigned int current_minor = cmVersion::GetMinorVersion();
  unsigned int current_patch = cmVersion::GetPatchVersion();
  unsigned int current_tweak = cmVersion::GetTweakVersion();

  // Parse at least two components of the version number.
  // Use zero for those not specified.
  unsigned int required_major = 0;
  unsigned int required_minor = 0;
  unsigned int required_patch = 0;
  unsigned int required_tweak = 0;
  if(sscanf(version_string.c_str(), "%u.%u.%u.%u",
            &required_major, &required_minor,
            &required_patch, &required_tweak) < 2)
    {
    std::ostringstream e;
    e << "could not parse VERSION \"" << version_string << "\".";
    this->SetError(e.str());
    return false;
    }

  // Compare the version numbers.
  if((current_major < required_major) ||
     (current_major == required_major &&
      current_minor < required_minor) ||
     (current_major == required_major &&
      current_minor == required_minor &&
      current_patch < required_patch) ||
     (current_major == required_major &&
      current_minor == required_minor &&
      current_patch == required_patch &&
      current_tweak < required_tweak))
    {
    // The current version is too low.
    std::ostringstream e;
    e << "CMake " << version_string
      << " or higher is required.  You are running version "
      << cmVersion::GetCMakeVersion();
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }

  // The version is not from the future, so enforce unknown arguments.
  if(!this->EnforceUnknownArguments())
    {
    return false;
    }

  if (required_major < 2 || (required_major == 2 && required_minor < 4))
  {
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.");
    this->Makefile->SetPolicyVersion("2.4");
  }
  else
  {
    this->Makefile->SetPolicyVersion(version_string.c_str());
  }

  return true;
}